

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManUpdateCopy(Vec_Int_t *vCopy,Gia_Man_t *p)

{
  uint Lit;
  int iVar1;
  int v;
  Gia_Obj_t *pGVar2;
  int local_24;
  int iLit;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  Vec_Int_t *vCopy_local;
  
  for (local_24 = 0; iVar1 = Vec_IntSize(vCopy), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vCopy,local_24);
    if (iVar1 != -1) {
      v = Abc_Lit2Var(iVar1);
      pGVar2 = Gia_ManObj(p,v);
      if (pGVar2->Value == 0xffffffff) {
        Vec_IntWriteEntry(vCopy,local_24,-1);
      }
      else {
        Lit = pGVar2->Value;
        iVar1 = Abc_LitIsCompl(iVar1);
        iVar1 = Abc_LitNotCond(Lit,iVar1);
        Vec_IntWriteEntry(vCopy,local_24,iVar1);
      }
    }
  }
  return;
}

Assistant:

void Gia_ManUpdateCopy( Vec_Int_t * vCopy, Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, iLit;
    Vec_IntForEachEntry( vCopy, iLit, i )
    {
        if ( iLit == -1 )
            continue;
        pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        if ( !~pObj->Value )
            Vec_IntWriteEntry( vCopy, i, -1 );
        else
            Vec_IntWriteEntry( vCopy, i, Abc_LitNotCond(pObj->Value, Abc_LitIsCompl(iLit)) );
    }
}